

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cc
# Opt level: O1

void __thiscall
onmt::Tokenizer::tokenize_text
          (Tokenizer *this,string *text,
          vector<onmt::Token,_std::allocator<onmt::Token>_> *annotated_tokens,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          *alphabets)

{
  ulong begin;
  CharType CVar1;
  Mode MVar2;
  __node_base_ptr p_Var3;
  _Hash_node_base *p_Var4;
  char cVar5;
  byte bVar6;
  int iVar7;
  Casing CVar8;
  mapped_type *pmVar9;
  __node_base_ptr p_Var10;
  ulong uVar11;
  char cVar12;
  ulong uVar13;
  ulong end;
  char *__s;
  __node_base_ptr p_Var14;
  CharType *pCVar15;
  ulong uVar16;
  CharInfo *character;
  int iVar17;
  CharInfo *c;
  pointer pCVar18;
  pointer pCVar19;
  bool bVar20;
  bool bVar21;
  vector<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_> chars;
  vector<int,_std::allocator<int>_> scripts;
  TokensBuilder builder;
  uint local_130;
  uint local_11c;
  uint local_118;
  allocator<char> local_111;
  vector<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_> local_110;
  vector<int,_std::allocator<int>_> local_f8;
  TokensBuilder local_e0;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_60;
  string *local_58;
  key_type local_50;
  
  local_60 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              *)alphabets;
  unicode::get_characters_info(&local_110,text);
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  std::vector<int,_std::allocator<int>_>::reserve
            (&local_f8,
             (long)local_110.
                   super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_110.
                   super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5);
  pCVar19 = local_110.
            super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (local_110.
      super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_110.
      super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar17 = -1;
    pCVar18 = local_110.
              super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      iVar7 = unicode::get_script(pCVar18->value,iVar17);
      local_e0._tokens =
           (vector<onmt::Token,_std::allocator<onmt::Token>_> *)
           CONCAT44(local_e0._tokens._4_4_,iVar7);
      if (local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_f8,
                   (iterator)
                   local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_e0);
      }
      else {
        *local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = iVar7;
        local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      if ((int)local_e0._tokens != -1) {
        iVar17 = (int)local_e0._tokens;
      }
      pCVar18 = pCVar18 + 1;
    } while (pCVar18 != pCVar19);
  }
  local_e0._current_token.surface._M_dataplus._M_p =
       (pointer)&local_e0._current_token.surface.field_2;
  local_e0._no_substitution = (this->_options).no_substitution;
  local_e0._current_token.surface._M_string_length = 0;
  local_e0._current_token.surface.field_2._M_local_buf[0] = '\0';
  local_e0._current_token.type = Word;
  local_e0._current_token.casing = None;
  local_e0._current_token.join_left = false;
  local_e0._current_token.join_right = false;
  local_e0._current_token.spacer = false;
  local_e0._current_token.preserve = false;
  local_e0._current_feature._M_dataplus._M_p = (pointer)&local_e0._current_feature.field_2;
  local_e0._current_token.features.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e0._current_token.features.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e0._current_token.features.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0._current_length = 0;
  local_e0._current_feature._M_string_length = 0;
  local_e0._current_feature.field_2._M_local_buf[0] = '\0';
  local_e0._tokens = annotated_tokens;
  if ((long)local_110.
            super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_110.
            super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>.
            _M_impl.super__Vector_impl_data._M_start != 0) {
    uVar11 = (long)local_110.
                   super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_110.
                   super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
    local_58 = &(this->_options).joiner;
    local_130 = 0xffffffff;
    iVar17 = 2;
    uVar16 = 0;
    do {
      iVar7 = local_110.
              super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar16].value;
      if (iVar7 != 0xfeff && 0x1f < iVar7) {
        begin = uVar16 + 1;
        end = begin;
        if (begin < uVar11) {
          pCVar15 = &local_110.
                     super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar16 + 1].char_type;
          uVar13 = begin;
          do {
            end = uVar13;
            if ((*pCVar15 != Mark) ||
               ((((this->_options).allow_isolated_marks & 1U) != 0 &&
                ((local_110.
                  super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar16].char_type == Separator ||
                 ((((this->_options).segment_alphabet_change & 1U) != 0 &&
                  (local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar13] !=
                   local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar16])))))))) break;
            uVar13 = uVar13 + 1;
            pCVar15 = pCVar15 + 8;
            end = uVar11;
          } while (uVar11 != uVar13);
        }
        character = local_110.
                    super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar16;
        pCVar19 = local_110.
                  super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start + end;
        if (uVar11 <= end) {
          pCVar19 = (pointer)0x0;
        }
        if (iVar17 == 4) {
          if (iVar7 == 0xff60) {
            std::__cxx11::string::append((char *)&local_e0._current_token,(ulong)character->data);
            local_e0._current_length = local_e0._current_length + 1;
            iVar17 = 0;
            local_130 = 0xfffffffe;
            if ((this->_options).preserve_placeholders == true) {
              local_e0._current_token.preserve = true;
            }
          }
          else {
            if (character->char_type != Separator) {
              std::__cxx11::string::append((char *)&local_e0._current_token,(ulong)character->data);
              goto LAB_001b560b;
            }
            iVar17 = 4;
            TokensBuilder::escape_append(&local_e0,character);
          }
        }
        else if (iVar7 == 0xff5f) {
          if (iVar17 != 2) {
            TokensBuilder::segment(&local_e0);
            if ((iVar17 == 1) || (iVar17 == 0 && local_130 != 0xfffffffe)) {
              local_e0._current_token.join_left = true;
            }
            else {
              ((local_e0._tokens)->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>).
              _M_impl.super__Vector_impl_data._M_finish[-1].join_right = true;
            }
          }
          std::__cxx11::string::append((char *)&local_e0._current_token,(ulong)character->data);
LAB_001b560b:
          local_e0._current_length = local_e0._current_length + 1;
          iVar17 = 4;
        }
        else if (character->char_type == Separator) {
          if (end == begin) {
            if (iVar17 != 2) {
              TokensBuilder::segment(&local_e0);
            }
            iVar17 = 2;
            if ((this->_options).with_separators == true) {
              std::__cxx11::string::append((char *)&local_e0._current_token,(ulong)character->data);
              local_e0._current_length = local_e0._current_length + 1;
              if ((pCVar19 == (pointer)0x0) || (pCVar19->char_type != Separator)) {
                TokensBuilder::segment(&local_e0);
              }
            }
            goto LAB_001b5619;
          }
          if (iVar17 != 2) {
            TokensBuilder::segment(&local_e0);
            local_e0._current_token.join_left = true;
          }
          TokensBuilder::escape_append(&local_e0,character);
          TokensBuilder::append(&local_e0,&local_110,begin,end);
          TokensBuilder::segment(&local_e0);
          iVar17 = 3;
LAB_001b55ec:
          uVar16 = end - 1;
        }
        else {
          if (((this->_options).support_prior_joiners == true) &&
             (iVar7 = std::__cxx11::string::compare
                                ((ulong)local_58,0,(char *)(this->_options).joiner._M_string_length,
                                 (ulong)character->data), iVar7 == 0)) {
            if (iVar17 == 2) {
              local_e0._current_token.join_left = true;
            }
            else {
              if (iVar17 == 3) {
                ((local_e0._tokens)->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>).
                _M_impl.super__Vector_impl_data._M_finish[-1].join_right = true;
                iVar17 = 3;
                goto LAB_001b5619;
              }
              TokensBuilder::segment(&local_e0);
              ((local_e0._tokens)->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>).
              _M_impl.super__Vector_impl_data._M_finish[-1].join_right = true;
            }
            iVar17 = 2;
            goto LAB_001b5619;
          }
          CVar1 = character->char_type;
          if (CVar1 == Letter) {
            local_11c = local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar16];
          }
          else {
            local_11c = -(uint)(CVar1 != Number) | 0xfffffffd;
          }
          if (local_60 !=
              (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               *)0x0) {
            __s = "Numeric";
            if (((CVar1 != Number) && (__s = "Other", CVar1 == Letter)) &&
               (__s = "Other", -1 < (int)local_11c)) {
              __s = unicode::get_script_name(local_11c);
            }
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_111);
            pmVar9 = std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[](local_60,&local_50);
            *pmVar9 = *pmVar9 + 1;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
          }
          MVar2 = (this->_options).mode;
          if (MVar2 == Conservative) {
            local_118 = 0xfffffffd;
            if ((CVar1 != Number) && (iVar7 = character->value, iVar7 != 0x5f)) {
              if (iVar17 == 0) {
                if (iVar7 == 0x2d) goto LAB_001b57b5;
                if (iVar7 == 0x2e) {
                  if (pCVar19 != (pointer)0x0) {
LAB_001b59f8:
                    if ((pCVar19->char_type & ~Number) == Letter) goto LAB_001b57b5;
                  }
                }
                else if ((pCVar19 != (pointer)0x0) && (iVar7 == 0x2c)) goto LAB_001b59f8;
              }
              goto LAB_001b56f1;
            }
          }
          else {
LAB_001b56f1:
            local_118 = local_11c;
            if (MVar2 == Char || CVar1 != Letter) {
              if (MVar2 == Char || CVar1 != Number) {
                if (iVar17 != 2) {
                  TokensBuilder::segment(&local_e0);
                  local_e0._current_token.join_left = true;
                  if (((this->_options).preserve_segmented_tokens == true) &&
                     (character->char_type == Mark)) {
                    local_e0._current_token.preserve = true;
                  }
                }
                TokensBuilder::safe_append(&local_e0,character);
                if (end != begin) {
                  TokensBuilder::append(&local_e0,&local_110,begin,end);
                  uVar16 = end - 1;
                }
                iVar17 = 3;
                TokensBuilder::segment(&local_e0);
                goto LAB_001b5619;
              }
              bVar6 = iVar17 == 1 & (this->_options).segment_numbers;
              if (iVar17 == 0 || bVar6 != 0) {
                if ((bVar6 & (this->_options).preserve_segmented_tokens) == 1) {
                  local_e0._current_token.preserve = true;
                }
                TokensBuilder::segment(&local_e0);
                if ((iVar17 == 0) && (local_130 != 0xfffffffe)) {
                  local_e0._current_token.join_left = true;
                }
                else {
LAB_001b5974:
                  ((local_e0._tokens)->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>
                  )._M_impl.super__Vector_impl_data._M_finish[-1].join_right = true;
                }
              }
              else if (iVar17 == 3) goto LAB_001b5974;
              TokensBuilder::safe_append(&local_e0,character);
              iVar17 = 1;
              if (end == begin) goto LAB_001b5619;
              TokensBuilder::append(&local_e0,&local_110,begin,end);
              goto LAB_001b55ec;
            }
          }
LAB_001b57b5:
          CVar8 = update_casing(local_e0._current_token.casing,character->case_type,
                                local_e0._current_length);
          if (iVar17 == 1) {
            bVar21 = false;
            bVar20 = false;
            cVar12 = '\0';
            goto LAB_001b58a7;
          }
          if (iVar17 == 0) {
            if ((int)local_118 < 0 || local_130 != local_118) {
              bVar20 = false;
            }
            else {
              uVar11 = (this->_options).segment_alphabet_codes._M_h._M_bucket_count;
              uVar13 = (ulong)local_118 % uVar11;
              p_Var3 = (this->_options).segment_alphabet_codes._M_h._M_buckets[uVar13];
              p_Var10 = (__node_base_ptr)0x0;
              if ((p_Var3 != (__node_base_ptr)0x0) &&
                 (p_Var10 = p_Var3, p_Var14 = p_Var3->_M_nxt,
                 local_118 != *(uint *)&p_Var3->_M_nxt[1]._M_nxt)) {
                while (p_Var4 = p_Var14->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
                  p_Var10 = (__node_base_ptr)0x0;
                  if (((ulong)(long)(int)*(uint *)&p_Var4[1]._M_nxt % uVar11 != uVar13) ||
                     (p_Var10 = p_Var14, p_Var14 = p_Var4, local_118 == *(uint *)&p_Var4[1]._M_nxt))
                  goto LAB_001b5a0d;
                }
                p_Var10 = (__node_base_ptr)0x0;
              }
LAB_001b5a0d:
              if (p_Var10 == (__node_base_ptr)0x0) {
                bVar20 = false;
              }
              else {
                bVar20 = p_Var10->_M_nxt != (_Hash_node_base *)0x0;
              }
              bVar21 = false;
              cVar12 = '\0';
              if (bVar20) goto LAB_001b58a7;
            }
            if (local_130 == local_118) {
              cVar12 = '\0';
              cVar5 = '\0';
              if (local_130 == 0xfffffffe) {
                bVar21 = false;
              }
              else {
LAB_001b5a5c:
                cVar12 = cVar5;
                if (((this->_options).segment_case != true) || (bVar21 = CVar8 == Mixed, !bVar21))
                goto LAB_001b5a70;
              }
            }
            else {
              cVar12 = (this->_options).segment_alphabet_change;
              bVar21 = false;
              if (((bool)cVar12 == false) && (cVar5 = cVar12, local_130 != 0xfffffffe))
              goto LAB_001b5a5c;
            }
LAB_001b58a7:
            local_e0._current_token.join_right = true;
            if (((this->_options).preserve_segmented_tokens == true) &&
               (((bVar21 || (bVar20)) || (cVar12 != '\0')))) {
              local_e0._current_token.preserve = true;
            }
            TokensBuilder::segment(&local_e0);
            CVar8 = update_casing(local_e0._current_token.casing,character->case_type,0);
            local_e0._current_token.casing = CVar8;
          }
          else {
LAB_001b5a70:
            local_e0._current_token.casing = CVar8;
            if ((iVar17 == 3) && (local_e0._current_token.surface._M_string_length == 0)) {
              ((local_e0._tokens)->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>).
              _M_impl.super__Vector_impl_data._M_finish[-1].join_right = true;
            }
          }
          local_130 = local_118;
          TokensBuilder::safe_append(&local_e0,character);
          iVar17 = 0;
          if (end != begin) {
            TokensBuilder::append(&local_e0,&local_110,begin,end);
            uVar16 = end - 1;
          }
        }
      }
LAB_001b5619:
      uVar16 = uVar16 + 1;
      uVar11 = (long)local_110.
                     super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_110.
                     super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
    } while (uVar16 < uVar11);
  }
  TokensBuilder::~TokensBuilder(&local_e0);
  if (local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_110.
      super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.
                    super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_110.
                          super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.
                          super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Tokenizer::tokenize_text(const std::string& text,
                                std::vector<Token>& annotated_tokens,
                                std::unordered_map<std::string, size_t>* alphabets) const
  {
    // TODO: this method has grown big and is hard to follow. It should be refactored into
    // smaller pieces to clarify its logic.

    const auto chars = unicode::get_characters_info(text);

    std::vector<int> scripts;

    {
      scripts.reserve(chars.size());
      int previous_script = -1;
      for (const auto& c : chars) {
        const int script = unicode::get_script(c.value, previous_script);
        scripts.emplace_back(script);
        if (script != -1)
          previous_script = script;
      }
    }

    TokensBuilder builder(_options, annotated_tokens);
    State state = State::Space;
    int prev_alphabet = -1;

    for (size_t i = 0; i < chars.size(); ++i)
    {
      const auto& c = chars[i];
      const unicode::code_point_t v = c.value;
      if (v < 32 || v == 0xFEFF)  // skip special characters and BOM
        continue;

      const size_t next_index = get_next_main_char(chars, scripts, i, _options);
      const auto* next_c = next_index < chars.size() ? &chars[next_index] : nullptr;
      const bool has_combining_marks = (next_index != i + 1);

      if (state == State::Placeholder)
      {
        if (v == ph_marker_close_cp)
        {
          builder.append(c);
          if (_options.preserve_placeholders)
            builder.current().preserve = true;
          prev_alphabet = placeholder_alphabet;
          state = State::Letter;
        }
        else if (c.char_type == unicode::CharType::Separator)
          builder.escape_append(c);
        else
          builder.append(c);
      }

      else if (v == ph_marker_open_cp)
      {
        if (state != State::Space)
        {
          builder.segment();
          if ((state == State::Letter && prev_alphabet != placeholder_alphabet)
              || state == State::Number)
            builder.current().join_left = true;
          else
            builder.previous().join_right = true;
        }
        builder.append(c);
        state = State::Placeholder;
      }

      else if (c.char_type == unicode::CharType::Separator)
      {
        if (has_combining_marks)
        {
          if (state != State::Space)
          {
            builder.segment();
            builder.current().join_left = true;
          }

          builder.escape_append(c);
          builder.append(chars, i + 1, next_index);
          builder.segment();
          i = next_index - 1;
          state = State::Other;
        }
        else
        {
          if (state != State::Space)
            builder.segment();

          if (_options.with_separators)
          {
            builder.append(c);
            if (!next_c || next_c->char_type != unicode::CharType::Separator)
              builder.segment();
          }

          state = State::Space;
        }
      }

      else if (_options.support_prior_joiners && c == _options.joiner)
      {
        if (state == State::Other)
          builder.previous().join_right = true;
        else if (state == State::Space)
          builder.current().join_left = true;
        else
        {
          builder.segment();
          builder.previous().join_right = true;
          state = State::Space;
        }
      }

      else
      {
        bool is_letter = c.char_type == unicode::CharType::Letter;
        bool is_number = c.char_type == unicode::CharType::Number;

        int alphabet = -1;
        if (is_number)
          alphabet = number_alphabet;
        else if (is_letter)
          alphabet = scripts[i];

        if (alphabets != nullptr)
        {
          const char* alphabet_name = "Other";
          if (is_number)
            alphabet_name = "Numeric";
          else if (is_letter && alphabet >= 0)
            alphabet_name = unicode::get_script_name(alphabet);
          (*alphabets)[alphabet_name]++;
        }

        if (_options.mode == Mode::Conservative)
        {
          if (is_number
              || (c == '_')
              || (state == State::Letter && c == '-')
              || (state == State::Letter
                  && (c == '.' || c == ',')
                  && next_c
                  && (next_c->char_type == unicode::CharType::Number
                      || next_c->char_type == unicode::CharType::Letter)))
          {
            is_letter = true;
            alphabet = number_alphabet;
          }
        }

        if (is_letter && _options.mode != Mode::Char)
        {
          const Casing new_casing = update_casing(builder.current().casing,
                                                  c.case_type,
                                                  builder.current_length());

          bool segment_case = false;
          bool segment_alphabet = false;
          bool segment_alphabet_change = false;
          if (state == State::Number
              || (state == State::Letter &&
                  ((segment_alphabet = (prev_alphabet == alphabet
                                        && alphabet >= 0
                                        && (_options.segment_alphabet_codes.find(alphabet)
                                            != _options.segment_alphabet_codes.end())))
                   || (segment_alphabet_change = (prev_alphabet != alphabet
                                                  && _options.segment_alphabet_change))
                   || (prev_alphabet == placeholder_alphabet)
                   || (_options.segment_case
                       && (segment_case = (new_casing == Casing::Mixed))))))
          {
            builder.current().join_right = true;
            if (_options.preserve_segmented_tokens
                && (segment_case || segment_alphabet || segment_alphabet_change))
              builder.current().preserve = true;
            builder.segment();
            builder.current().casing = update_casing(builder.current().casing, c.case_type, 0);
          }
          else
          {
            builder.current().casing = new_casing;
            if (state == State::Other && builder.is_new_token())
              builder.previous().join_right = true;
          }

          builder.safe_append(c);
          if (has_combining_marks)
          {
            builder.append(chars, i + 1, next_index);
            i = next_index - 1;
          }
          state = State::Letter;
          prev_alphabet = alphabet;
        }
        else if (is_number && _options.mode != Mode::Char)
        {
          const bool segment_number = (_options.segment_numbers && state == State::Number);
          if (state == State::Letter || segment_number)
          {
            if (_options.preserve_segmented_tokens && segment_number)
              builder.current().preserve = true;
            builder.segment();
            if (state != State::Letter || prev_alphabet == placeholder_alphabet)
              builder.previous().join_right = true;
            else
              builder.current().join_left = true;
          }
          else if (state == State::Other)
          {
            builder.previous().join_right = true;
          }

          builder.safe_append(c);
          if (has_combining_marks)
          {
            builder.append(chars, i + 1, next_index);
            i = next_index - 1;
          }
          state = State::Number;
        }
        else
        {
          if (state != State::Space)
          {
            builder.segment();
            builder.current().join_left = true;
            if (_options.preserve_segmented_tokens && c.char_type == unicode::CharType::Mark)
              builder.current().preserve = true;
          }

          builder.safe_append(c);
          if (has_combining_marks)
          {
            builder.append(chars, i + 1, next_index);
            i = next_index - 1;
          }
          builder.segment();
          state = State::Other;
        }
      }
    }
  }